

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall aggreports::LoadPeriodsToWeighting(aggreports *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool *pbVar3;
  FILE *__stream;
  size_t sVar4;
  mapped_type_conflict *pmVar5;
  Periods p;
  allocator local_79;
  string local_78;
  string local_58;
  mapped_type_conflict local_38;
  key_type local_2c;
  mapped_type_conflict local_28;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar4 = fread(&local_2c,0xc,1,__stream);
    if (sVar4 != 0) {
      do {
        local_38 = local_28;
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&this->periodstoweighting_,&local_2c);
        *pmVar5 = local_38;
        sVar4 = fread(&local_2c,0xc,1,__stream);
      } while (sVar4 != 0);
    }
    if ((this->outputFlags_[3] != false) || (this->outputFlags_[7] == true)) {
      sVar2 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((sVar2 == 0) || (this->useReturnPeriodFile_ != false)) {
        if ((sVar2 != 0) && (this->ordFlag_ == true)) {
          std::__cxx11::string::string((string *)&local_58,this->progname_,&local_79);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"INFO","");
          logprintf(&local_58,&local_78,
                    "Tail Value at Risk for Wheatsheaf mean/per sample mean is not supported if you wish to use non-uniform period weights..\n"
                   );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_58,this->progname_,&local_79);
        paVar1 = &local_78.field_2;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WARNING","");
        logprintf(&local_58,&local_78,
                  "Return periods file must be present if you wish to use non-uniform period weights for Wheatsheaf mean/per sample mean output.\n"
                 );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        std::__cxx11::string::string((string *)&local_58,this->progname_,&local_79);
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"INFO","");
        logprintf(&local_58,&local_78,
                  "Wheatsheaf mean/per sample mean output will not be produced.\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        pbVar3 = this->outputFlags_;
        pbVar3[3] = false;
        pbVar3[7] = false;
      }
    }
  }
  return;
}

Assistant:

void aggreports::LoadPeriodsToWeighting() {

  FILE *fin = fopen(PERIODS_FILE, "rb");
  if (fin == nullptr) return;

  Periods p;
  while (fread(&p, sizeof(Periods), 1, fin) != 0) {
    periodstoweighting_[p.period_no] = p.weighting;
  }

  // User must define return periods if he/she wishes to use non-uniform period
  // weights for Wheatsheaf/per sample mean output
  if (outputFlags_[AGG_WHEATSHEAF_MEAN] == true ||
      outputFlags_[OCC_WHEATSHEAF_MEAN] == true) {
    if (periodstoweighting_.size() > 0 && useReturnPeriodFile_ == false) {
      logprintf(progname_, "WARNING", "Return periods file must be present if "
				      "you wish to use non-uniform period "
				      "weights for Wheatsheaf mean/per sample "
				      "mean output.\n");
      logprintf(progname_, "INFO", "Wheatsheaf mean/per sample mean output "
				   "will not be produced.\n");
      outputFlags_[AGG_WHEATSHEAF_MEAN] = false;
      outputFlags_[OCC_WHEATSHEAF_MEAN] = false;
    } else if (periodstoweighting_.size() > 0 && ordFlag_ == true) {
      logprintf(progname_, "INFO", "Tail Value at Risk for Wheatsheaf mean/per "
				   "sample mean is not supported if you wish "
				   "to use non-uniform period weights..\n");
    }
  }

}